

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O1

Vec_Int_t * Abc_ObjDressClass(Vec_Ptr_t *vRes,Vec_Int_t *vClass2Num,int Class)

{
  uint uVar1;
  undefined8 *puVar2;
  void *pvVar3;
  void **ppvVar4;
  int iVar5;
  
  if (Class < 1) {
    __assert_fail("Class > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDress2.c"
                  ,0xb9,"Vec_Int_t *Abc_ObjDressClass(Vec_Ptr_t *, Vec_Int_t *, int)");
  }
  if (vClass2Num->nSize <= Class) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar1 = vClass2Num->pArray[(uint)Class];
  if ((ulong)uVar1 == 0) {
    __assert_fail("ClassNumber != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDress2.c"
                  ,0xbb,"Vec_Int_t *Abc_ObjDressClass(Vec_Ptr_t *, Vec_Int_t *, int)");
  }
  if (0 < (int)uVar1) {
    if (vRes->nSize <= (int)uVar1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    ppvVar4 = vRes->pArray + uVar1;
    goto LAB_002b7677;
  }
  vClass2Num->pArray[(uint)Class] = vRes->nSize;
  puVar2 = (undefined8 *)malloc(0x10);
  *puVar2 = 0x10;
  pvVar3 = malloc(0x40);
  puVar2[1] = pvVar3;
  uVar1 = vRes->nCap;
  if (vRes->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vRes->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vRes->pArray,0x80);
      }
      vRes->pArray = ppvVar4;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_002b764e;
      if (vRes->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vRes->pArray,(ulong)uVar1 << 4);
      }
      vRes->pArray = ppvVar4;
    }
    vRes->nCap = iVar5;
  }
LAB_002b764e:
  iVar5 = vRes->nSize;
  vRes->nSize = iVar5 + 1U;
  vRes->pArray[iVar5] = puVar2;
  if ((long)iVar5 < 0) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  ppvVar4 = vRes->pArray + ((ulong)(iVar5 + 1U) - 1);
LAB_002b7677:
  return (Vec_Int_t *)*ppvVar4;
}

Assistant:

Vec_Int_t * Abc_ObjDressClass( Vec_Ptr_t * vRes, Vec_Int_t * vClass2Num, int Class )
{
    int ClassNumber;
    assert( Class > 0 );
    ClassNumber = Vec_IntEntry( vClass2Num, Class );
    assert( ClassNumber != 0 );
    if ( ClassNumber > 0 )
        return (Vec_Int_t *)Vec_PtrEntry( vRes, ClassNumber ); // previous class
    // create new class
    Vec_IntWriteEntry( vClass2Num, Class, Vec_PtrSize(vRes) );
    Vec_PtrPush( vRes, Vec_IntAlloc(4) );
    return (Vec_Int_t *)Vec_PtrEntryLast( vRes ); 
}